

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O1

int Saig_SynchSavePattern
              (Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,int iPat,Vec_Str_t *vSequence)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  size_t __size;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  
  if (nWords * 0x10 <= iPat) {
    __assert_fail("iPat < 16 * nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                  ,0x147,
                  "int Saig_SynchSavePattern(Aig_Man_t *, Vec_Ptr_t *, int, int, Vec_Str_t *)");
  }
  if (0 < pAig->nTruePis) {
    lVar7 = 0;
    do {
      if (pAig->vCis->nSize <= lVar7) goto LAB_006eeb53;
      iVar4 = *(int *)((long)pAig->vCis->pArray[lVar7] + 0x24);
      if (((long)iVar4 < 0) || (vSimInfo->nSize <= iVar4)) goto LAB_006eeb53;
      uVar6 = *(uint *)((long)vSimInfo->pArray[iVar4] + (long)(iPat >> 4) * 4);
      uVar9 = vSequence->nCap;
      if (vSequence->nSize == uVar9) {
        if ((int)uVar9 < 0x10) {
          if (vSequence->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vSequence->pArray,0x10);
          }
          vSequence->pArray = pcVar5;
          __size = 0x10;
        }
        else {
          __size = (ulong)uVar9 * 2;
          if ((int)__size <= (int)uVar9) goto LAB_006eea10;
          if (vSequence->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(__size);
          }
          else {
            pcVar5 = (char *)realloc(vSequence->pArray,__size);
          }
          vSequence->pArray = pcVar5;
        }
        vSequence->nCap = (int)__size;
      }
LAB_006eea10:
      iVar4 = vSequence->nSize;
      vSequence->nSize = iVar4 + 1;
      vSequence->pArray[iVar4] = (byte)(uVar6 >> ((char)iPat * '\x02' & 0x1eU)) & 3;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pAig->nTruePis);
  }
  if (pAig->nRegs < 1) {
    iVar4 = 0;
  }
  else {
    pVVar2 = pAig->vCos;
    iVar8 = 0;
    iVar4 = 0;
    do {
      uVar6 = pAig->nTruePos + iVar8;
      if (((((int)uVar6 < 0) || (pVVar2->nSize <= (int)uVar6)) ||
          (uVar9 = pAig->nTruePis + iVar8, (int)uVar9 < 0)) || (pAig->vCis->nSize <= (int)uVar9)) {
LAB_006eeb53:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = *(int *)((long)pVVar2->pArray[uVar6] + 0x24);
      if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_006eeb53;
      uVar6 = *(uint *)((long)vSimInfo->pArray[iVar1] + (long)(iPat >> 4) * 4) >>
              ((char)iPat * '\x02' & 0x1eU) & 3;
      iVar1 = *(int *)((long)pAig->vCis->pArray[uVar9] + 0x24);
      if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_006eeb53;
      if (0 < nWords) {
        if (uVar6 == 2) {
          __assert_fail("v == 0 || v == 1 || v == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                        ,0x37,"unsigned int Saig_SynchTernary(int)");
        }
        pvVar3 = vSimInfo->pArray[iVar1];
        uVar9 = -(uint)(uVar6 != 1) | 0x55555555;
        if (uVar6 == 0) {
          uVar9 = 0;
        }
        uVar10 = 0;
        do {
          *(uint *)((long)pvVar3 + uVar10 * 4) = uVar9;
          uVar10 = uVar10 + 1;
        } while ((uint)nWords != uVar10);
      }
      iVar4 = iVar4 + (uint)(uVar6 == 3);
      iVar8 = iVar8 + 1;
    } while (iVar8 < pAig->nRegs);
  }
  return iVar4;
}

Assistant:

int Saig_SynchSavePattern( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, int iPat, Vec_Str_t * vSequence )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    unsigned * pSim;
    int Counter, Value, i, w;
    assert( iPat < 16 * nWords );
    Saig_ManForEachPi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        Value = (pSim[iPat>>4] >> ((iPat&0xf) << 1)) & 3;
        Vec_StrPush( vSequence, (char)Value );
//        printf( "%d ", Value );
    }
//    printf( "\n" );
    Counter = 0;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLi->Id );
        Value = (pSim[iPat>>4] >> ((iPat&0xf) << 1)) & 3;
        Counter += (Value == 3);
        // save patern in the same register
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLo->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = Saig_SynchTernary( Value );
    }
    return Counter;
}